

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

bool chaiscript::Boxed_Number::equals(Boxed_Number *t_lhs,Boxed_Number *t_rhs)

{
  bool bVar1;
  Boxed_Number local_28;
  Boxed_Number *local_18;
  Boxed_Number *t_rhs_local;
  Boxed_Number *t_lhs_local;
  
  local_18 = t_rhs;
  t_rhs_local = t_lhs;
  oper(&local_28,equals,&t_lhs->bv,&t_rhs->bv);
  bVar1 = boxed_cast<bool>(&local_28.bv,(Type_Conversions_State *)0x0);
  Boxed_Value::~Boxed_Value(&local_28.bv);
  return bVar1;
}

Assistant:

static bool equals(const Boxed_Number &t_lhs, const Boxed_Number &t_rhs) {
      return boxed_cast<bool>(oper(Operators::Opers::equals, t_lhs.bv, t_rhs.bv));
    }